

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O0

void __thiscall
JsUtil::BackgroundJobProcessor::RemoveManager(BackgroundJobProcessor *this,JobManager *manager)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JobManager *pJVar4;
  Job *pJVar5;
  WaitableJobManager *waitableManager_2;
  Job *job_1;
  WaitableJobManager *waitableManager_1;
  Job *next_1;
  Job *removedJob_1;
  WaitableJobManager *waitableManager;
  Job *next;
  Job *removedJob;
  Job *job;
  Job *firstJob;
  AutoCriticalSection local_28;
  AutoCriticalSection lock;
  ParallelThreadData *threadDataProcessingCurrentJob;
  JobManager *manager_local;
  BackgroundJobProcessor *this_local;
  
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x372,"(manager)","manager");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  lock.cs = (CriticalSection *)0x0;
  AutoCriticalSection::AutoCriticalSection(&local_28,&this->criticalSection);
  bVar2 = JobProcessor::HasManager(&this->super_JobProcessor,manager);
  if (bVar2) {
    DoublyLinkedList<JsUtil::JobManager,_Memory::ArenaAllocator>::Unlink
              (&(this->super_JobProcessor).managers,manager);
    if (manager->numJobsAddedToProcessor == 0) {
      pJVar5 = GetCurrentJobOfManager(this,manager);
      if (pJVar5 != (Job *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                           ,0x382,"(!GetCurrentJobOfManager(manager))",
                           "!GetCurrentJobOfManager(manager)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      bVar2 = true;
    }
    else {
      job = (Job *)0x0;
      for (removedJob = DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::Head
                                  (&(this->super_JobProcessor).jobs); removedJob != (Job *)0x0;
          removedJob = DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::Next
                                 (&removedJob->
                                   super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>
                                 )) {
        pJVar4 = Job::Manager(removedJob);
        if (pJVar4 == manager) {
          if (job == (Job *)0x0) {
            job = removedJob;
          }
        }
        else if (job != (Job *)0x0) {
          pJVar5 = DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::Previous
                             (&removedJob->
                               super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>);
          DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::UnlinkSubsequence
                    (&(this->super_JobProcessor).jobs,job,pJVar5);
          next = job;
          pJVar5 = next;
          while (next = pJVar5, next != (Job *)0x0) {
            pJVar5 = DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::Next
                               (&next->
                                 super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>)
            ;
            bVar2 = Job::IsCritical(next);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                 ,0x395,"(!removedJob->IsCritical())","!removedJob->IsCritical()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 0;
            }
            if (this->numJobs == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                 ,0x396,"(numJobs != 0)","numJobs != 0");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 0;
            }
            this->numJobs = this->numJobs - 1;
            JobProcessor::JobProcessed(&this->super_JobProcessor,manager,next,false);
            if (manager->numJobsAddedToProcessor == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                 ,0x399,"(manager->numJobsAddedToProcessor != 0)",
                                 "manager->numJobsAddedToProcessor != 0");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 0;
            }
            manager->numJobsAddedToProcessor = manager->numJobsAddedToProcessor - 1;
            if (((manager->isWaitable & 1U) != 0) && ((Job *)manager[1]._vptr_JobManager == next)) {
              Event::Set((Event *)&manager[1].
                                   super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>
                        );
              manager[1]._vptr_JobManager = (_func_int **)0x0;
            }
          }
          job = (Job *)0x0;
        }
      }
      if (job != (Job *)0x0) {
        DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::UnlinkSubsequenceFromEnd
                  (&(this->super_JobProcessor).jobs,job);
        next_1 = job;
        pJVar5 = next_1;
        while (next_1 = pJVar5, next_1 != (Job *)0x0) {
          pJVar5 = DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::Next
                             (&next_1->
                               super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>);
          bVar2 = Job::IsCritical(next_1);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3af,"(!removedJob->IsCritical())","!removedJob->IsCritical()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
          if (this->numJobs == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3b0,"(numJobs != 0)","numJobs != 0");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
          this->numJobs = this->numJobs - 1;
          JobProcessor::JobProcessed(&this->super_JobProcessor,manager,next_1,false);
          if (manager->numJobsAddedToProcessor == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3b3,"(manager->numJobsAddedToProcessor != 0)",
                               "manager->numJobsAddedToProcessor != 0");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
          manager->numJobsAddedToProcessor = manager->numJobsAddedToProcessor - 1;
          if (((manager->isWaitable & 1U) != 0) && ((Job *)manager[1]._vptr_JobManager == next_1)) {
            Event::Set((Event *)&manager[1].
                                 super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>
                      );
            manager[1]._vptr_JobManager = (_func_int **)0x0;
          }
        }
      }
      if (manager->numJobsAddedToProcessor == 0) {
        JobProcessor::LastJobProcessed(&this->super_JobProcessor,manager);
        bVar2 = true;
      }
      else {
        if (manager->numJobsAddedToProcessor == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3c8,"(manager->numJobsAddedToProcessor >= 1)",
                             "manager->numJobsAddedToProcessor >= 1");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        if ((manager->isWaitable & 1U) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3c9,"(manager->isWaitable)","manager->isWaitable");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        pJVar5 = GetCurrentJobOfManager(this,manager);
        if (pJVar5 == (Job *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3ca,"(GetCurrentJobOfManager(manager))",
                             "GetCurrentJobOfManager(manager)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        bVar2 = false;
      }
    }
  }
  else {
    bVar2 = true;
  }
  AutoCriticalSection::~AutoCriticalSection(&local_28);
  if (!bVar2) {
    CCLock::Enter(&(this->criticalSection).super_CCLock);
    while (pJVar5 = GetCurrentJobOfManager(this,manager), pJVar5 != (Job *)0x0) {
      if (manager[1]._vptr_JobManager != (_func_int **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                           ,0x3d9,"(!waitableManager->jobBeingWaitedUpon)",
                           "!waitableManager->jobBeingWaitedUpon");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      manager[1]._vptr_JobManager = (_func_int **)pJVar5;
      Event::Reset((Event *)&manager[1].
                             super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>
                  );
      lock.cs = (CriticalSection *)
                GetThreadDataFromCurrentJob(this,(Job *)manager[1]._vptr_JobManager);
      CCLock::Leave(&(this->criticalSection).super_CCLock);
      WaitWithThread(this,(ParallelThreadData *)lock.cs,
                     (Event *)&manager[1].
                               super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>
                     ,0xffffffff);
      CCLock::Enter(&(this->criticalSection).super_CCLock);
      manager[1]._vptr_JobManager = (_func_int **)0x0;
    }
    CCLock::Leave(&(this->criticalSection).super_CCLock);
  }
  return;
}

Assistant:

void BackgroundJobProcessor::RemoveManager(JobManager *const manager)
    {
        Assert(manager);

        ParallelThreadData *threadDataProcessingCurrentJob = nullptr;
        {
            AutoCriticalSection lock(&criticalSection);
            // Managers must remove themselves. Hence, Close does not remove managers. So, not asserting on !IsClosed().

            if (!HasManager(manager))
            {
                // Since this manager isn't owned by this processor, no need to remove and cleanup
                return;
            }

            managers.Unlink(manager);
            if(manager->numJobsAddedToProcessor == 0)
            {
                Assert(!GetCurrentJobOfManager(manager));
                return;
            }

            // Remove this manager's jobs from the queue
            Job *firstJob = 0;
            for(Job *job = jobs.Head(); job; job = job->Next())
            {
                if(job->Manager() == manager)
                {
                    if(!firstJob)
                        firstJob = job;
                }
                else if(firstJob)
                {
                    jobs.UnlinkSubsequence(firstJob, job->Previous());
                    for(Job *removedJob = firstJob; removedJob;)
                    {
                        Job *const next = removedJob->Next();
                        Assert(!removedJob->IsCritical());
                        Assert(numJobs != 0);
                        --numJobs;
                        JobProcessed(manager, removedJob, false); // the job may be deleted during this and should not be used afterwards
                        Assert(manager->numJobsAddedToProcessor != 0);
                        --manager->numJobsAddedToProcessor;
                        if(manager->isWaitable)
                        {
                            WaitableJobManager *const waitableManager = static_cast<WaitableJobManager *>(manager);
                            if(waitableManager->jobBeingWaitedUpon == removedJob)
                            {
                                waitableManager->jobBeingWaitedUponProcessed.Set();
                                waitableManager->jobBeingWaitedUpon = 0;
                            }
                        }
                        removedJob = next;
                    }
                    firstJob = 0;
                }
            }
            if(firstJob)
            {
                jobs.UnlinkSubsequenceFromEnd(firstJob);
                for(Job *removedJob = firstJob; removedJob;)
                {
                    Job *const next = removedJob->Next();
                    Assert(!removedJob->IsCritical());
                    Assert(numJobs != 0);
                    --numJobs;
                    JobProcessed(manager, removedJob, false); // the job may be deleted during this and should not be used afterwards
                    Assert(manager->numJobsAddedToProcessor != 0);
                    --manager->numJobsAddedToProcessor;
                    if(manager->isWaitable)
                    {
                        WaitableJobManager *const waitableManager = static_cast<WaitableJobManager *>(manager);
                        if(waitableManager->jobBeingWaitedUpon == removedJob)
                        {
                            waitableManager->jobBeingWaitedUponProcessed.Set();
                            waitableManager->jobBeingWaitedUpon = 0;
                        }
                    }
                    removedJob = next;
                }
            }

            if(manager->numJobsAddedToProcessor == 0)
            {
                LastJobProcessed(manager);
                return;
            }

            Assert(manager->numJobsAddedToProcessor >= 1);
            Assert(manager->isWaitable);
            Assert(GetCurrentJobOfManager(manager));

        }

        //Wait for all the on going jobs to complete.
        criticalSection.Enter();
        while (true)
        {
            Job *job = GetCurrentJobOfManager(manager);
            if (!job)
            {
                break;
            }

            WaitableJobManager * const waitableManager = static_cast<WaitableJobManager *>(manager);
            Assert(!waitableManager->jobBeingWaitedUpon);

            waitableManager->jobBeingWaitedUpon = job;
            waitableManager->jobBeingWaitedUponProcessed.Reset();

            threadDataProcessingCurrentJob = GetThreadDataFromCurrentJob(waitableManager->jobBeingWaitedUpon);
            criticalSection.Leave();

            WaitWithThread(threadDataProcessingCurrentJob, waitableManager->jobBeingWaitedUponProcessed);

            criticalSection.Enter();
            waitableManager->jobBeingWaitedUpon = 0;
        }
        criticalSection.Leave();
    }